

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O2

void __thiscall Voice::~Voice(Voice *this)

{
  __pointer_type ptr;
  
  LOCK();
  ptr = (this->mUpdate)._M_b._M_p;
  (this->mUpdate)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  al_free(ptr);
  std::_Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::~_Vector_base
            (&(this->mChans).
              super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>);
  return;
}

Assistant:

~Voice() { delete mUpdate.exchange(nullptr, std::memory_order_acq_rel); }